

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

float ImGui::NavUpdatePageUpPageDown(int allowed_dir_flags)

{
  ImGuiNavLayer IVar1;
  ImGuiWindow *this;
  ImGuiContext *pIVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  bool local_3a;
  bool local_39;
  float local_38;
  float nav_scoring_rect_offset_y;
  float page_offset_y;
  ImRect *nav_rect_rel;
  bool page_down_held;
  bool page_up_held;
  ImGuiWindow *window;
  ImGuiContext *g;
  int allowed_dir_flags_local;
  
  pIVar2 = GImGui;
  if ((((GImGui->NavMoveDir == -1) && (GImGui->NavWindow != (ImGuiWindow *)0x0)) &&
      ((GImGui->NavWindow->Flags & 0x40000U) == 0)) &&
     ((GImGui->NavWindowingTarget == (ImGuiWindow *)0x0 && (GImGui->NavLayer == ImGuiNavLayer_Main))
     )) {
    this = GImGui->NavWindow;
    local_39 = IsKeyDown((GImGui->IO).KeyMap[5]);
    local_39 = local_39 && (allowed_dir_flags & 4U) != 0;
    local_3a = IsKeyDown((pIVar2->IO).KeyMap[6]);
    local_3a = local_3a && (allowed_dir_flags & 8U) != 0;
    if (local_39 != local_3a) {
      if (((this->DC).NavLayerActiveMask != 0) || (((this->DC).NavHasScroll & 1U) == 0)) {
        IVar1 = pIVar2->NavLayer;
        fVar5 = ImRect::GetHeight(&this->InnerRect);
        fVar4 = ImGuiWindow::CalcFontSize(this);
        fVar6 = ImRect::GetHeight(this->NavRectRel + IVar1);
        fVar5 = ImMax<float>(0.0,-fVar4 + fVar5 + fVar6);
        local_38 = 0.0;
        bVar3 = IsKeyPressed((pIVar2->IO).KeyMap[5],true);
        if (bVar3) {
          pIVar2->NavMoveDir = 3;
          pIVar2->NavMoveClipDir = 2;
          pIVar2->NavMoveRequestFlags = 0x30;
          local_38 = -fVar5;
        }
        else {
          bVar3 = IsKeyPressed((pIVar2->IO).KeyMap[6],true);
          if (bVar3) {
            pIVar2->NavMoveDir = 2;
            pIVar2->NavMoveClipDir = 3;
            pIVar2->NavMoveRequestFlags = 0x30;
            local_38 = fVar5;
          }
        }
        return local_38;
      }
      bVar3 = IsKeyPressed((pIVar2->IO).KeyMap[5],true);
      if (bVar3) {
        fVar5 = (this->Scroll).y;
        fVar4 = ImRect::GetHeight(&this->InnerRect);
        SetScrollY(this,fVar5 - fVar4);
      }
      else {
        bVar3 = IsKeyPressed((pIVar2->IO).KeyMap[6],true);
        if (bVar3) {
          fVar5 = (this->Scroll).y;
          fVar4 = ImRect::GetHeight(&this->InnerRect);
          SetScrollY(this,fVar5 + fVar4);
        }
      }
    }
  }
  return 0.0;
}

Assistant:

static float ImGui::NavUpdatePageUpPageDown(int allowed_dir_flags)
{
    ImGuiContext& g = *GImGui;
    if (g.NavMoveDir != ImGuiDir_None || g.NavWindow == NULL)
        return 0.0f;
    if ((g.NavWindow->Flags & ImGuiWindowFlags_NoNavInputs) || g.NavWindowingTarget != NULL || g.NavLayer != 0)
        return 0.0f;

    ImGuiWindow* window = g.NavWindow;
    bool page_up_held = IsKeyDown(g.IO.KeyMap[ImGuiKey_PageUp]) && (allowed_dir_flags & (1 << ImGuiDir_Up));
    bool page_down_held = IsKeyDown(g.IO.KeyMap[ImGuiKey_PageDown]) && (allowed_dir_flags & (1 << ImGuiDir_Down));
    if (page_up_held != page_down_held) // If either (not both) are pressed
    {
        if (window->DC.NavLayerActiveMask == 0x00 && window->DC.NavHasScroll)
        {
            // Fallback manual-scroll when window has no navigable item
            if (IsKeyPressed(g.IO.KeyMap[ImGuiKey_PageUp], true))
                SetScrollY(window, window->Scroll.y - window->InnerRect.GetHeight());
            else if (IsKeyPressed(g.IO.KeyMap[ImGuiKey_PageDown], true))
                SetScrollY(window, window->Scroll.y + window->InnerRect.GetHeight());
        }
        else
        {
            const ImRect& nav_rect_rel = window->NavRectRel[g.NavLayer];
            const float page_offset_y = ImMax(0.0f, window->InnerRect.GetHeight() - window->CalcFontSize() * 1.0f + nav_rect_rel.GetHeight());
            float nav_scoring_rect_offset_y = 0.0f;
            if (IsKeyPressed(g.IO.KeyMap[ImGuiKey_PageUp], true))
            {
                nav_scoring_rect_offset_y = -page_offset_y;
                g.NavMoveDir = ImGuiDir_Down; // Because our scoring rect is offset, we intentionally request the opposite direction (so we can always land on the last item)
                g.NavMoveClipDir = ImGuiDir_Up;
                g.NavMoveRequestFlags = ImGuiNavMoveFlags_AllowCurrentNavId | ImGuiNavMoveFlags_AlsoScoreVisibleSet;
            }
            else if (IsKeyPressed(g.IO.KeyMap[ImGuiKey_PageDown], true))
            {
                nav_scoring_rect_offset_y = +page_offset_y;
                g.NavMoveDir = ImGuiDir_Up; // Because our scoring rect is offset, we intentionally request the opposite direction (so we can always land on the last item)
                g.NavMoveClipDir = ImGuiDir_Down;
                g.NavMoveRequestFlags = ImGuiNavMoveFlags_AllowCurrentNavId | ImGuiNavMoveFlags_AlsoScoreVisibleSet;
            }
            return nav_scoring_rect_offset_y;
        }
    }
    return 0.0f;
}